

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assetsys.h
# Opt level: O0

int mz_zip_reader_locate_file_binary_search(mz_zip_archive *pZip,char *pFilename)

{
  mz_uint mVar1;
  uint uVar2;
  uint uVar3;
  mz_zip_internal_state *pmVar4;
  void *pvVar5;
  void *pvVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  size_t sVar10;
  mz_uint8 *pmVar11;
  int local_bc;
  uint local_ac;
  int comp;
  int file_index;
  int m;
  int h;
  int l;
  mz_uint filename_len;
  int size;
  mz_uint32 *pIndices;
  mz_zip_array *pCentral_dir;
  mz_zip_array *pCentral_dir_offsets;
  mz_zip_internal_state *pState;
  char *pFilename_local;
  mz_zip_archive *pZip_local;
  byte local_46;
  byte local_45;
  mz_uint8 r;
  mz_uint8 l_1;
  mz_uint l_len;
  mz_uint8 *pE;
  mz_uint8 *pL;
  byte *local_28;
  
  pmVar4 = pZip->m_pState;
  pvVar5 = (pmVar4->m_sorted_central_dir_offsets).m_p;
  mVar1 = pZip->m_total_files;
  sVar10 = strlen(pFilename);
  uVar7 = (uint)sVar10;
  m = 0;
  file_index = mVar1 - 1;
  do {
    if (file_index < m) {
      return -1;
    }
    iVar8 = m + file_index >> 1;
    uVar2 = *(uint *)((long)pvVar5 + (long)iVar8 * 4);
    pvVar6 = (pmVar4->m_central_dir).m_p;
    uVar3 = *(uint *)((long)(pmVar4->m_central_dir_offsets).m_p + (ulong)uVar2 * 4);
    uVar9 = (uint)*(ushort *)((long)pvVar6 + (ulong)uVar3 + 0x1c);
    local_45 = 0;
    local_46 = 0;
    pE = (mz_uint8 *)((long)pvVar6 + (ulong)uVar3 + 0x2e);
    local_ac = uVar7;
    if (uVar9 < uVar7) {
      local_ac = uVar9;
    }
    pmVar11 = pE + local_ac;
    local_28 = (byte *)pFilename;
    for (; pE < pmVar11; pE = pE + 1) {
      if ((*pE < 0x41) || (0x5a < *pE)) {
        local_45 = *pE;
      }
      else {
        local_45 = *pE + 0x20;
      }
      if (((char)*local_28 < 'A') || ('Z' < (char)*local_28)) {
        local_46 = *local_28;
      }
      else {
        local_46 = *local_28 + 0x20;
      }
      if (local_45 != local_46) break;
      local_28 = local_28 + 1;
    }
    if (pE == pmVar11) {
      local_bc = uVar9 - uVar7;
    }
    else {
      local_bc = (uint)local_45 - (uint)local_46;
    }
    if (local_bc == 0) {
      return uVar2;
    }
    if (local_bc < 0) {
      m = iVar8 + 1;
    }
    else {
      file_index = iVar8 + -1;
    }
  } while( true );
}

Assistant:

static int mz_zip_reader_locate_file_binary_search(mz_zip_archive *pZip, const char *pFilename)
{
  mz_zip_internal_state *pState = pZip->m_pState;
  const mz_zip_array *pCentral_dir_offsets = &pState->m_central_dir_offsets;
  const mz_zip_array *pCentral_dir = &pState->m_central_dir;
  mz_uint32 *pIndices = &MZ_ZIP_ARRAY_ELEMENT(&pState->m_sorted_central_dir_offsets, mz_uint32, 0);
  const int size = pZip->m_total_files;
  const mz_uint filename_len = (mz_uint)strlen(pFilename);
  int l = 0, h = size - 1;
  while (l <= h)
  {
    int m = (l + h) >> 1, file_index = pIndices[m], comp = mz_zip_reader_filename_compare(pCentral_dir, pCentral_dir_offsets, file_index, pFilename, filename_len);
    if (!comp)
      return file_index;
    else if (comp < 0)
      l = m + 1;
    else
      h = m - 1;
  }
  return -1;
}